

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlFeatures.cpp
# Opt level: O0

void __thiscall
GdlFeatureDefn::SetLabelFromNameTable(GdlFeatureDefn *this,int nNameID,int nLangID,uint8 *pNameTbl)

{
  long lVar1;
  undefined2 in_SI;
  long in_RDI;
  uint8 *in_stack_00000010;
  int in_stack_00000018;
  int in_stack_0000001c;
  wstring *in_stack_00000020;
  utf16 in_stack_0000002e;
  GdlFeatureDefn *in_stack_00000030;
  wstring stuName;
  wstring local_58 [32];
  wstring local_38 [44];
  undefined2 local_c;
  
  local_c = in_SI;
  GetLabelFromNameTable_abi_cxx11_(in_stack_0000001c,in_stack_00000018,in_stack_00000010);
  lVar1 = std::__cxx11::wstring::length();
  if (lVar1 != 0) {
    std::__cxx11::wstring::wstring(local_58,local_38);
    AddExtName(in_stack_00000030,in_stack_0000002e,in_stack_00000020);
    std::__cxx11::wstring::~wstring(local_58);
    *(undefined2 *)(in_RDI + 0xc0) = local_c;
  }
  std::__cxx11::wstring::~wstring(local_38);
  return;
}

Assistant:

void GdlFeatureDefn::SetLabelFromNameTable(int nNameID, int nLangID, uint8 * pNameTbl)
{
	std::wstring stuName = GdlFeatureDefn::GetLabelFromNameTable(nNameID, nLangID, pNameTbl);
	if (stuName.length() != 0)
	{
		AddExtName(nLangID, stuName);
		m_wNameTblId = nNameID;
	}
}